

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

void __thiscall
Jinx::Impl::Parser::ParsePropertyDeclaration(Parser *this,VisibilityType scope,bool readOnly)

{
  pointer pSVar1;
  pointer pbVar2;
  pointer pcVar3;
  Symbol *pSVar4;
  int iVar5;
  mapped_type *this_00;
  element_type *this_01;
  pointer pbVar6;
  char *pcVar7;
  element_type *this_02;
  bool bVar8;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  PropertyName propertyName;
  String name;
  String libraryName;
  undefined1 local_f8 [16];
  undefined1 local_e8 [80];
  String local_98;
  String local_78;
  Variant local_58;
  
  if (this->m_error != false) {
    return;
  }
  pSVar1 = (this->m_currentSymbol)._M_current;
  if (pSVar1 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    pcVar7 = "Unexpected end of script when parsing property declaration";
LAB_001222f0:
    Error<>(this,pcVar7);
    return;
  }
  if (pSVar1->type != NameValue) {
    pcVar7 = "Unexpected symbol type when parsing property declaration";
    goto LAB_001222f0;
  }
  pbVar6 = (this->m_importList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_importList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pbVar6 == pbVar2;
  if (!bVar8) {
    do {
      pcVar3 = (pbVar6->_M_dataplus)._M_p;
      local_f8._0_8_ = (Library *)local_e8;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          local_f8,pcVar3,pcVar3 + pbVar6->_M_string_length);
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_f8
                      ,&((this->m_currentSymbol)._M_current)->text);
      if (iVar5 == 0) {
        Error<>(this,"Property name cannot start with an import library name");
        if ((Library *)local_f8._0_8_ != (Library *)local_e8) {
          MemFree((void *)local_f8._0_8_,local_e8._0_8_ + 1);
        }
        if (!bVar8) {
          return;
        }
        break;
      }
      if ((Library *)local_f8._0_8_ != (Library *)local_e8) {
        MemFree((void *)local_f8._0_8_,local_e8._0_8_ + 1);
      }
      pbVar6 = pbVar6 + 1;
      bVar8 = pbVar6 == pbVar2;
    } while (!bVar8);
  }
  this_02 = (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (element_type *)
            (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(this_01->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
               super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(this_01->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(this_01->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
               super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(this_01->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  CheckLibraryName_abi_cxx11_(&local_78,this);
  if (local_78._M_string_length != 0) {
    Runtime::GetLibrary((Runtime *)local_f8,
                        (String *)
                        (this->m_runtime).
                        super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    this_02 = (element_type *)local_f8._0_8_;
    if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8))->
                 _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8))->
                      _M_weak_this).
                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8))->
                 _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8))->
                      _M_weak_this).
                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    if (this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    pSVar4 = (this->m_currentSymbol)._M_current;
    this->m_lastLine = pSVar4->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar4 + 1;
    this_01 = (element_type *)local_f8._8_8_;
  }
  if (((this->m_error != false) ||
      (pSVar1 = (this->m_currentSymbol)._M_current,
      pSVar1 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) || (pSVar1->type != NameValue)) {
    Error<>(this,"Property name expected");
    goto LAB_0012248a;
  }
  local_f8._0_4_ = 0x3f;
  symbols._M_len = 1;
  symbols._M_array = (iterator)local_f8;
  ParseMultiName_abi_cxx11_(&local_98,this,symbols);
  bVar8 = Library::PropertyNameExists(this_02,&local_98);
  if (bVar8) {
    pSVar1 = (this->m_currentSymbol)._M_current;
    if ((this->m_symbolList->
        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
        super__Vector_impl_data._M_start < pSVar1) {
      (this->m_currentSymbol)._M_current = pSVar1 + -1;
    }
    Error<>(this,"Property is already defined");
  }
  else {
    local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
    Variant::SetNull(&local_58);
    PropertyName::PropertyName
              ((PropertyName *)local_f8,scope,readOnly,&this_02->m_name,&local_98,&local_58);
    Variant::~Variant(&local_58);
    bVar8 = Library::RegisterPropertyName(this_02,(PropertyName *)local_f8,true);
    if (bVar8) {
      EmitOpcode(this,Property);
      PropertyName::Write((PropertyName *)local_f8,&this->m_writer);
      if (((this->m_error == false) &&
          (pSVar1 = (this->m_currentSymbol)._M_current,
          pSVar1 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) && (pSVar1->type == To)) {
        this->m_lastLine = pSVar1->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar1 + 1;
        ParseExpression(this,(this->m_symbolList->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        Expect(this,NewLine,"Error parsing expression");
        EmitOpcode(this,SetProp);
        local_58._0_8_ = local_f8._0_8_;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &(this->m_writer).m_pos,&local_58,8);
        local_58._0_8_ = local_f8._0_8_;
        this_00 = std::
                  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                  ::operator[](&this->m_idNameMap,(key_type *)&local_58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                  (this_00,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                           local_e8);
      }
      else {
        if (readOnly) {
          pcVar7 = "Must assign property an initial value";
          goto LAB_00122626;
        }
        Expect(this,NewLine,"Error declaring property");
      }
    }
    else {
      pcVar7 = "Error registering property name.  Possible duplicate.";
LAB_00122626:
      Error<>(this,pcVar7);
    }
    PropertyName::~PropertyName((PropertyName *)local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
              (&local_98,local_98.field_2._M_allocated_capacity);
  }
LAB_0012248a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    MemFree(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  return;
}

Assistant:

inline_t void Parser::ParsePropertyDeclaration(VisibilityType scope, bool readOnly)
	{
		if (m_error)
			return;

		if (m_currentSymbol == m_symbolList.end())
		{
			Error("Unexpected end of script when parsing property declaration");
			return;
		}
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing property declaration");
			return;
		}

		// Check if first keyword matches a library name
		for (auto libName : m_importList)
		{
			if (libName == m_currentSymbol->text)
			{
				Error("Property name cannot start with an import library name");
				return;
			}
		}

		// Find out which library this property belongs to
		auto propertyLibrary = m_library;
		auto libraryName = CheckLibraryName();
		if (!libraryName.empty())
		{
			propertyLibrary = m_runtime->GetLibraryInternal(libraryName);
			NextSymbol();
		}

		// Parse the property name
		if (!CheckName())
		{
			Error("Property name expected");
			return;
		}

		// Search for multi-part property names
		String name = ParseMultiName({ SymbolType::To });

		if (propertyLibrary->PropertyNameExists(name))
		{
			PreviousSymbol();
			Error("Property is already defined");
			return;
		}

		// Create a PropertyName object for registration
		PropertyName propertyName(scope, readOnly, propertyLibrary->GetName(), name);

		// Register the property name, and check for duplicates
		if (!propertyLibrary->RegisterPropertyName(propertyName, true))
		{
			Error("Error registering property name.  Possible duplicate.");
			return;
		}

		// Set property value
		EmitOpcode(Opcode::Property);
		propertyName.Write(m_writer);

		if (Accept(SymbolType::To))
		{
			// Parse expression
			ParseExpression();
			Expect(SymbolType::NewLine, "Error parsing expression");

			// Set property opcode
			EmitOpcode(Opcode::SetProp);
			EmitId(propertyName.GetId());
			m_idNameMap[propertyName.GetId()] = propertyName.GetName();
		}
		else if (readOnly)
		{
			// A declaration with no assignment is allowed, but not for a readonly property			
			Error("Must assign property an initial value");
			return;
		}
		else
		{
			Expect(SymbolType::NewLine, "Error declaring property");
		}
	}